

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap_unittest.cc
# Opt level: O2

void TestMap<TCMalloc_PageMap1<10>>(int limit,bool limit_is_below_the_overflow_boundary)

{
  AssertHelperData *pAVar1;
  _Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var2;
  ulong uVar3;
  undefined1 __first [8];
  pointer __last;
  void *pvVar4;
  AssertHelperData *pAVar5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var6;
  AssertHelperData *pAVar7;
  char *pcVar8;
  AssertHelperData *pAVar9;
  undefined1 local_1400 [8];
  AssertionResult gtest_ar;
  undefined1 auStack_68 [8];
  vector<long,_std::allocator<long>_> elements;
  AssertHelper local_48;
  bool local_39;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_38;
  bool limit_is_below_the_overflow_boundary_local;
  
  local_39 = limit_is_below_the_overflow_boundary;
  printf("Running test with %d iterations...\n",(ulong)(uint)limit);
  pvVar4 = calloc(1,0x2000);
  pAVar7 = (AssertHelperData *)(long)limit;
  pAVar5 = (AssertHelperData *)0x0;
  if (0 < (long)pAVar7) {
    pAVar5 = pAVar7;
  }
  pAVar9 = (AssertHelperData *)0x0;
  while (pAVar5 != pAVar9) {
    pAVar1 = (AssertHelperData *)((long)&pAVar9->type + 1);
    *(AssertHelperData **)((long)pvVar4 + (long)pAVar9 * 8) = pAVar1;
    auStack_68 = (undefined1  [8])
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (pAVar9 < (AssertHelperData *)0x400) {
      auStack_68 = (undefined1  [8])pAVar1;
    }
    _Stack_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar1;
    testing::internal::CmpHelperEQ<void*,void*>
              ((internal *)local_1400,"map.get(i)","(void*)(i+1)",(void **)auStack_68,
               &stack0xffffffffffffffc8._M_head_impl);
    if (local_1400[0] == (internal)0x0) {
      testing::Message::Message((Message *)auStack_68);
      if (gtest_ar._0_8_ == 0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffc8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                 ,0x3b,pcVar8);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)auStack_68);
      goto LAB_00108d27;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    pAVar9 = pAVar1;
  }
  pAVar9 = (AssertHelperData *)0x0;
  while (pAVar5 != pAVar9) {
    if (pAVar9 < (AssertHelperData *)0x400) {
      auStack_68 = *(undefined1 (*) [8])
                    &((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)pvVar4 + (long)pAVar9 * 8))->_M_t;
    }
    else {
      auStack_68 = (undefined1  [8])0x0;
    }
    pAVar9 = (AssertHelperData *)((long)&pAVar9->type + 1);
    _Stack_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar9;
    testing::internal::CmpHelperEQ<void*,void*>
              ((internal *)local_1400,"map.get(i)","(void*)(i+1)",(void **)auStack_68,
               &stack0xffffffffffffffc8._M_head_impl);
    if (local_1400[0] == (internal)0x0) {
      testing::Message::Message((Message *)auStack_68);
      if (gtest_ar._0_8_ == 0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffc8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                 ,0x3e,pcVar8);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)auStack_68);
      goto LAB_00108d27;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
  }
  pvVar4 = calloc(1,0x2000);
  _Var6._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while (pAVar5 != (AssertHelperData *)_Var6._M_head_impl) {
    _Var2.
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          )((long)_Var6._M_head_impl + 1);
    ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      *)((long)pvVar4 + (long)_Var6._M_head_impl * 8))->
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         = _Var2.
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    auStack_68 = (undefined1  [8])
                 (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  )0x0;
    if (_Var6._M_head_impl <
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400) {
      auStack_68 = (undefined1  [8])
                   _Var2.
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
    }
    _Stack_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         _Var2.
         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    testing::internal::CmpHelperEQ<void*,void*>
              ((internal *)local_1400,"map.get(i)","(void*)(i+1)",(void **)auStack_68,
               &stack0xffffffffffffffc8._M_head_impl);
    if (local_1400[0] == (internal)0x0) {
      testing::Message::Message((Message *)auStack_68);
      if (gtest_ar._0_8_ == 0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffc8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                 ,0x47,pcVar8);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)auStack_68);
      goto LAB_00108d27;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         _Var2.
         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  pAVar9 = (AssertHelperData *)0x0;
  while (pAVar5 != pAVar9) {
    if (pAVar9 < (AssertHelperData *)0x400) {
      auStack_68 = *(undefined1 (*) [8])((long)pvVar4 + (long)pAVar9 * 8);
    }
    else {
      auStack_68 = (undefined1  [8])0x0;
    }
    pAVar9 = (AssertHelperData *)((long)&pAVar9->type + 1);
    _Stack_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar9;
    testing::internal::CmpHelperEQ<void*,void*>
              ((internal *)local_1400,"map.get(i)","(void*)(i+1)",(void **)auStack_68,
               &stack0xffffffffffffffc8._M_head_impl);
    if (local_1400[0] == (internal)0x0) {
      testing::Message::Message((Message *)auStack_68);
      if (gtest_ar._0_8_ == 0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffc8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                 ,0x4a,pcVar8);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)auStack_68);
LAB_00108d27:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
      if (auStack_68 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)auStack_68 + 8))();
      }
      goto LAB_00108d46;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
  }
  auStack_68[0] = (ulong)(long)(limit + 1) <= 0x400U - (long)pAVar7;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_1400,"map.Ensure(limit, limit+1)",
             "limit_is_below_the_overflow_boundary",(bool *)auStack_68,&local_39);
  if (local_1400[0] == (internal)0x0) {
    testing::Message::Message((Message *)auStack_68);
    if (gtest_ar._0_8_ == 0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
               ,0x51,pcVar8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)auStack_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
    if (auStack_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)auStack_68 + 8))();
    }
LAB_00108d46:
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    return;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  for (local_1400 = (undefined1  [8])0x0;
      __last = elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start, __first = auStack_68,
      (long)local_1400 < (long)pAVar7; local_1400 = (undefined1  [8])((long)local_1400 + 1)) {
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)auStack_68,(value_type_conflict *)local_1400);
  }
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)local_1400,0x2a);
  std::
  shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)__first,
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)__last,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_1400);
  pvVar4 = calloc(1,0x2000);
  for (pAVar7 = (AssertHelperData *)0x0; pAVar5 != pAVar7;
      pAVar7 = (AssertHelperData *)((long)&pAVar7->type + 1)) {
    uVar3 = *(ulong *)((long)auStack_68 + (long)pAVar7 * 8);
    local_48.data_ = (AssertHelperData *)(uVar3 + 1);
    *(AssertHelperData **)((long)pvVar4 + uVar3 * 8) = local_48.data_;
    _Stack_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (AssertHelperData *)0x0;
    if (uVar3 < 0x400) {
      _Stack_38._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48.data_
      ;
    }
    testing::internal::CmpHelperEQ<void*,void*>
              ((internal *)local_1400,"map.get(elements[i])","(void*)(elements[i]+1)",
               &stack0xffffffffffffffc8._M_head_impl,&local_48.data_);
    if (local_1400[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffc8);
      if (gtest_ar._0_8_ == 0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                 ,0x5d,pcVar8);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&stack0xffffffffffffffc8);
      goto LAB_00108ea3;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
  }
  pAVar7 = (AssertHelperData *)0x0;
  while( true ) {
    if (pAVar5 == pAVar7) goto LAB_00108ec7;
    if (pAVar7 < (AssertHelperData *)0x400) {
      _Stack_38._M_head_impl =
           *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((long)pvVar4 + (long)pAVar7 * 8);
    }
    else {
      _Stack_38._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    pAVar7 = (AssertHelperData *)((long)&pAVar7->type + 1);
    local_48.data_ = pAVar7;
    testing::internal::CmpHelperEQ<void*,void*>
              ((internal *)local_1400,"map.get(i)","(void*)(i+1)",
               &stack0xffffffffffffffc8._M_head_impl,&local_48.data_);
    if (local_1400[0] == (internal)0x0) break;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
  }
  testing::Message::Message((Message *)&stack0xffffffffffffffc8);
  if (gtest_ar._0_8_ == 0) {
    pcVar8 = "";
  }
  else {
    pcVar8 = *(char **)gtest_ar._0_8_;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
             ,0x60,pcVar8);
  testing::internal::AssertHelper::operator=(&local_48,(Message *)&stack0xffffffffffffffc8);
LAB_00108ea3:
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if ((AssertHelperData *)_Stack_38._M_head_impl != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)_Stack_38._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
LAB_00108ec7:
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)auStack_68);
  return;
}

Assistant:

void TestMap(int limit, bool limit_is_below_the_overflow_boundary) {
  printf("Running test with %d iterations...\n", limit);

  { // Test sequential ensure/assignment
    Type map(malloc);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.Ensure(i, 1);
      map.set(i, (void*)(i+1));
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }

  { // Test bulk Ensure
    Type map(malloc);
    map.Ensure(0, limit);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.set(i, (void*)(i+1));
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }

  // Test that we correctly notice overflow
  {
    Type map(malloc);
    ASSERT_EQ(map.Ensure(limit, limit+1), limit_is_below_the_overflow_boundary);
  }

  { // Test randomized accesses
    std::vector<intptr_t> elements;
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) elements.push_back(i);
    std::shuffle(elements.begin(), elements.end(), std::mt19937(42));

    Type map(malloc);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.Ensure(elements[i], 1);
      map.set(elements[i], (void*)(elements[i]+1));
      ASSERT_EQ(map.get(elements[i]), (void*)(elements[i]+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }
}